

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

SIMDLoad * __thiscall
wasm::Builder::makeSIMDLoad
          (Builder *this,SIMDLoadOp op,Address offset,Address align,Expression *ptr,Name memory)

{
  SIMDLoad *pSVar1;
  SIMDLoad *ret;
  Expression *ptr_local;
  SIMDLoadOp op_local;
  Builder *this_local;
  Address align_local;
  Address offset_local;
  
  pSVar1 = MixedArena::alloc<wasm::SIMDLoad>((MixedArena *)(this->wasm + 0x158));
  pSVar1->op = op;
  (pSVar1->offset).addr = offset.addr;
  (pSVar1->align).addr = align.addr;
  pSVar1->ptr = ptr;
  Name::operator=(&pSVar1->memory,&memory);
  wasm::SIMDLoad::finalize();
  return pSVar1;
}

Assistant:

SIMDLoad* makeSIMDLoad(SIMDLoadOp op,
                         Address offset,
                         Address align,
                         Expression* ptr,
                         Name memory) {
    auto* ret = wasm.allocator.alloc<SIMDLoad>();
    ret->op = op;
    ret->offset = offset;
    ret->align = align;
    ret->ptr = ptr;
    ret->memory = memory;
    ret->finalize();
    return ret;
  }